

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3IsRowid(char *z)

{
  uint uVar1;
  char *pcVar2;
  byte bVar3;
  byte *pbVar4;
  uchar *a;
  byte bVar5;
  
  bVar3 = *z;
  bVar5 = bVar3;
  if (bVar3 == 0) {
    pcVar2 = "_ROWID_";
  }
  else {
    pbVar4 = (byte *)(z + 1);
    pcVar2 = "_ROWID_";
    do {
      if (""[bVar5] != ""[(byte)*pcVar2]) break;
      pcVar2 = (char *)((byte *)pcVar2 + 1);
      bVar5 = *pbVar4;
      pbVar4 = pbVar4 + 1;
    } while (bVar5 != 0);
  }
  uVar1 = 1;
  if (""[bVar5] != ""[(byte)*pcVar2]) {
    bVar5 = bVar3;
    if (bVar3 == 0) {
      pcVar2 = "ROWID";
    }
    else {
      pbVar4 = (byte *)(z + 1);
      pcVar2 = "ROWID";
      do {
        if (""[bVar5] != ""[(byte)*pcVar2]) break;
        pcVar2 = (char *)((byte *)pcVar2 + 1);
        bVar5 = *pbVar4;
        pbVar4 = pbVar4 + 1;
      } while (bVar5 != 0);
    }
    if (""[bVar5] != ""[(byte)*pcVar2]) {
      if (bVar3 == 0) {
        pcVar2 = "OID";
      }
      else {
        pbVar4 = (byte *)(z + 1);
        pcVar2 = "OID";
        do {
          if (""[bVar3] != ""[(byte)*pcVar2]) break;
          pcVar2 = (char *)((byte *)pcVar2 + 1);
          bVar3 = *pbVar4;
          pbVar4 = pbVar4 + 1;
        } while (bVar3 != 0);
      }
      uVar1 = (uint)(""[bVar3] == ""[(byte)*pcVar2]);
    }
  }
  return uVar1;
}

Assistant:

SQLITE_API int sqlite3_stricmp(const char *zLeft, const char *zRight){
  register unsigned char *a, *b;
  a = (unsigned char *)zLeft;
  b = (unsigned char *)zRight;
  while( *a!=0 && UpperToLower[*a]==UpperToLower[*b]){ a++; b++; }
  return UpperToLower[*a] - UpperToLower[*b];
}